

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<28>::SubshellData::verifySize(int NPL,int NTR)

{
  uint uVar1;
  undefined8 *puVar2;
  char *args;
  
  uVar1 = NTR * 6 + 6;
  args = (char *)(ulong)uVar1;
  if (uVar1 == NPL) {
    return;
  }
  tools::Log::error<char_const*>(args);
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NTR value: {}",NTR);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NTR ) {

  if ( NPL != ( NTR + 1 ) * 6 ) {

    Log::error( "Encountered illegal NPL and NTR values " );
    Log::info( "NPL must be equal to 6*NTR+6 for fission yield data" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NTR value: {}", NTR );
    throw std::exception();
  }
}